

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O1

void __thiscall
soul::ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>::
~ArrayWithPreallocation
          (ArrayWithPreallocation<soul::ResolutionPass::FunctionResolver::PossibleFunction,_4UL>
           *this)

{
  this->numActive = 0;
  if (4 < this->numAllocated) {
    if (this->items != (PossibleFunction *)0x0) {
      operator_delete__(this->items);
    }
    this->items = (PossibleFunction *)this->space;
    this->numAllocated = 4;
  }
  return;
}

Assistant:

void clear() noexcept
    {
        for (size_t i = 0; i < numActive; ++i)
            items[i].~Item();

        numActive = 0;
        freeIfHeapAllocated();
    }